

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Bidec(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  char *pcVar3;
  uint fVerbose;
  
  fVerbose = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    do {
      iVar1 = Extra_UtilGetopt(argc,argv,"lvh");
    } while (iVar1 == 0x6c);
    if (iVar1 == -1) break;
    if (iVar1 != 0x76) {
      Abc_Print(-2,"usage: &bidec [-vh]\n");
      Abc_Print(-2,"\t         performs heavy rewriting of the AIG\n");
      pcVar3 = "yes";
      if (fVerbose == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
      pcVar3 = "\t-h     : print the command usage\n";
      iVar1 = -2;
LAB_0027b793:
      Abc_Print(iVar1,pcVar3);
      return 1;
    }
    fVerbose = fVerbose ^ 1;
  }
  pGVar2 = pAbc->pGia;
  if (pGVar2 == (Gia_Man_t *)0x0) {
    pcVar3 = "Abc_CommandAbc9Bidec(): There is no AIG.\n";
  }
  else {
    if (pGVar2->vMapping != (Vec_Int_t *)0x0) {
      pGVar2 = Gia_ManPerformBidec(pGVar2,fVerbose);
      Abc_FrameUpdateGia(pAbc,pGVar2);
      return 0;
    }
    pcVar3 = "Abc_CommandAbc9Bidec(): Mapping of the AIG is not defined.\n";
  }
  iVar1 = -1;
  goto LAB_0027b793;
}

Assistant:

int Abc_CommandAbc9Bidec( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    int c, fVerbose = 0;
    int fUpdateLevel = 1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "lvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'l':
            fUpdateLevel ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Bidec(): There is no AIG.\n" );
        return 1;
    }
    if ( !Gia_ManHasMapping(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9Bidec(): Mapping of the AIG is not defined.\n" );
        return 1;
    }
    pTemp = Gia_ManPerformBidec( pAbc->pGia, fVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &bidec [-vh]\n" );
    Abc_Print( -2, "\t         performs heavy rewriting of the AIG\n" );
//    Abc_Print( -2, "\t-l     : toggle level update during rewriting [default = %s]\n", fUpdateLevel? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}